

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O2

void __thiscall PcodeGenerator::MergeSelfAssign(PcodeGenerator *this)

{
  vector<Pcode,_std::allocator<Pcode>_> *this_00;
  PcodeType PVar1;
  pointer pPVar2;
  __type _Var3;
  bool bVar4;
  iterator __position;
  Pcode *pPVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  string num1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_pcode_queue;
  iVar9 = 0;
  iVar6 = 0;
  do {
    while( true ) {
      uVar8 = (ulong)iVar9;
      __position._M_current =
           (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
           super__Vector_impl_data._M_start;
      pPVar5 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (((long)pPVar5 - (long)__position._M_current) / 0x88 - 1U <= uVar8) break;
      std::__cxx11::string::string
                ((string *)&local_70,(string *)&__position._M_current[uVar8].m_num1);
      iVar7 = iVar9 + 1;
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 &(this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar7].m_num2);
      _Var3 = std::operator==(&local_70,&local_50);
      if (_Var3) {
        PVar1 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar7].m_op;
        std::__cxx11::string::~string((string *)&local_50);
        if (((PVar1 == ASSIGN) && (bVar4 = GlobalJudge(&local_70), !bVar4)) &&
           (bVar4 = FPJudge(&local_70), !bVar4)) {
          pPVar2 = (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::__cxx11::string::string((string *)&local_50,(string *)&pPVar2[iVar7].m_num1);
          std::__cxx11::string::_M_assign((string *)&pPVar2[uVar8].m_num1);
          std::__cxx11::string::~string((string *)&local_50);
          (this_00->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar7].m_op = NOP;
          iVar6 = iVar6 + 1;
          iVar7 = iVar9 + 2;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_50);
      }
      iVar9 = iVar7;
      std::__cxx11::string::~string((string *)&local_70);
    }
    while (__position._M_current != pPVar5) {
      if ((__position._M_current)->m_op == NOP) {
        __position = std::vector<Pcode,_std::allocator<Pcode>_>::erase
                               (this_00,__position._M_current);
        pPVar5 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
    iVar9 = 0;
    bVar4 = iVar6 != 0;
    iVar6 = 0;
  } while (bVar4);
  return;
}

Assistant:

void PcodeGenerator::MergeSelfAssign() {
    int count;
    do {
        count = 0;
        for (int i=0; i<m_pcode_queue.size()-1; ++i) {
            string num1 = m_pcode_queue[i].GetNum1();
            if (num1 == m_pcode_queue[i+1].GetNum2() && m_pcode_queue[i+1].GetOP() == ASSIGN) {
                if (GlobalJudge(num1) || FPJudge(num1))
                    continue;
                m_pcode_queue[i].SetNum1(m_pcode_queue[i+1].GetNum1());
                m_pcode_queue[i+1].SetOP(NOP);
                i++;
                count++;
            }
        }
        for (auto iter = m_pcode_queue.begin(); iter != m_pcode_queue.end();) {
            if (iter->GetOP() == NOP) {
                iter = m_pcode_queue.erase(iter);
            } else {
                iter++;
            }
        }
    } while (count != 0);
}